

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

ssize_t tunnel_send_callback
                  (nghttp2_session *session,int32_t stream_id,uint8_t *buf,size_t length,
                  uint32_t *data_flags,nghttp2_data_source *source,void *userp)

{
  _Bool _Var1;
  nghttp2_session *pnVar2;
  tunnel_stream *local_78;
  ssize_t nread;
  void *pvStack_60;
  CURLcode result;
  tunnel_stream *ts;
  Curl_easy *data;
  cf_h2_proxy_ctx *ctx;
  Curl_cfilter *cf;
  nghttp2_data_source *source_local;
  uint32_t *data_flags_local;
  size_t length_local;
  uint8_t *buf_local;
  nghttp2_session *pnStack_18;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  ctx = (cf_h2_proxy_ctx *)userp;
  data = *(Curl_easy **)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    local_78 = (tunnel_stream *)0x0;
  }
  else {
    local_78 = *(tunnel_stream **)(*(long *)((long)userp + 0x10) + 8);
  }
  ts = local_78;
  if (stream_id == 0) {
    session_local = (nghttp2_session *)0xfffffffffffffe0b;
  }
  else {
    cf = (Curl_cfilter *)source;
    source_local = (nghttp2_data_source *)data_flags;
    data_flags_local = (uint32_t *)length;
    length_local = (size_t)buf;
    buf_local._4_4_ = stream_id;
    pnStack_18 = session;
    pvStack_60 = nghttp2_session_get_stream_user_data(session,stream_id);
    if (pvStack_60 == (void *)0x0) {
      session_local = (nghttp2_session *)0xfffffffffffffc7a;
    }
    else {
      pnVar2 = (nghttp2_session *)
               Curl_bufq_read((bufq *)((long)pvStack_60 + 0x48),(uchar *)length_local,
                              (size_t)data_flags_local,(CURLcode *)((long)&nread + 4));
      if ((long)pnVar2 < 0) {
        if (nread._4_4_ == 0x51) {
          session_local = (nghttp2_session *)0xfffffffffffffe04;
        }
        else {
          session_local = (nghttp2_session *)0xfffffffffffffc7a;
        }
      }
      else {
        if (((*(byte *)((long)pvStack_60 + 0xa4) >> 1 & 1) != 0) &&
           (_Var1 = Curl_bufq_is_empty((bufq *)((long)pvStack_60 + 0x48)), _Var1)) {
          source_local->fd = 1;
        }
        session_local = pnVar2;
        if ((((ts != (tunnel_stream *)0x0) &&
             ((*(ulong *)((long)&ts[0xf].sendbuf.chunk_size + 2) >> 0x1c & 1) != 0)) &&
            (ctx != (cf_h2_proxy_ctx *)0x0)) && (0 < *(int *)((long)&(ctx->h2->streams).mem + 4))) {
          Curl_trc_cf_infof((Curl_easy *)ts,(Curl_cfilter *)ctx,"[%d] tunnel_send_callback -> %zd",
                            (ulong)*(uint *)((long)pvStack_60 + 0x90),pnVar2);
        }
      }
    }
  }
  return (ssize_t)session_local;
}

Assistant:

static ssize_t tunnel_send_callback(nghttp2_session *session,
                                    int32_t stream_id,
                                    uint8_t *buf, size_t length,
                                    uint32_t *data_flags,
                                    nghttp2_data_source *source,
                                    void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  struct tunnel_stream *ts;
  CURLcode result;
  ssize_t nread;

  (void)source;
  (void)data;
  (void)ctx;

  if(!stream_id)
    return NGHTTP2_ERR_INVALID_ARGUMENT;

  ts = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!ts)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  DEBUGASSERT(ts == &ctx->tunnel);

  nread = Curl_bufq_read(&ts->sendbuf, buf, length, &result);
  if(nread < 0) {
    if(result != CURLE_AGAIN)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    return NGHTTP2_ERR_DEFERRED;
  }
  if(ts->closed && Curl_bufq_is_empty(&ts->sendbuf))
    *data_flags = NGHTTP2_DATA_FLAG_EOF;

  CURL_TRC_CF(data, cf, "[%d] tunnel_send_callback -> %zd",
              ts->stream_id, nread);
  return nread;
}